

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

int rgbcx::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  uint32_t i_1;
  float *pfVar9;
  uint32_t i;
  long lVar10;
  long lVar11;
  bc1_approx_mode mode;
  uint uVar12;
  byte *pbVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  byte local_8b [3];
  uint8_t local_88 [104];
  
  mode = (bc1_approx_mode)ctx;
  local_88[0] = '\0';
  local_88[1] = '\b';
  local_88[2] = '\x10';
  local_88[3] = '\x18';
  local_88[4] = '!';
  local_88[5] = ')';
  local_88[6] = '1';
  local_88[7] = '9';
  local_88[8] = 'B';
  local_88[9] = 'J';
  local_88[10] = 'R';
  local_88[0xb] = 'Z';
  local_88[0xc] = 'c';
  local_88[0xd] = 'k';
  local_88[0xe] = 's';
  local_88[0xf] = '{';
  local_88[0x10] = 0x84;
  local_88[0x11] = 0x8c;
  local_88[0x12] = 0x94;
  local_88[0x13] = 0x9c;
  local_88[0x14] = 0xa5;
  local_88[0x15] = 0xad;
  local_88[0x16] = 0xb5;
  local_88[0x17] = 0xbd;
  local_88[0x18] = 0xc6;
  local_88[0x19] = 0xce;
  local_88[0x1a] = 0xd6;
  local_88[0x1b] = 0xde;
  local_88[0x1c] = 0xe7;
  local_88[0x1d] = 0xef;
  local_88[0x1e] = 0xf7;
  local_88[0x1f] = 0xff;
  g_bc1_approx_mode = mode;
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_1,local_88,0x20,mode);
  prepare_bc1_single_color_table_half((bc1_match_entry *)g_bc1_match5_half,local_88,0x20,mode);
  local_88[0x20] = '\0';
  local_88[0x21] = '\x04';
  local_88[0x22] = '\b';
  local_88[0x23] = '\f';
  local_88[0x24] = '\x10';
  local_88[0x25] = '\x14';
  local_88[0x26] = '\x18';
  local_88[0x27] = '\x1c';
  local_88[0x28] = ' ';
  local_88[0x29] = '$';
  local_88[0x2a] = '(';
  local_88[0x2b] = ',';
  local_88[0x2c] = '0';
  local_88[0x2d] = '4';
  local_88[0x2e] = '8';
  local_88[0x2f] = '<';
  local_88[0x30] = 'A';
  local_88[0x31] = 'E';
  local_88[0x32] = 'I';
  local_88[0x33] = 'M';
  local_88[0x34] = 'Q';
  local_88[0x35] = 'U';
  local_88[0x36] = 'Y';
  local_88[0x37] = ']';
  local_88[0x38] = 'a';
  local_88[0x39] = 'e';
  local_88[0x3a] = 'i';
  local_88[0x3b] = 'm';
  local_88[0x3c] = 'q';
  local_88[0x3d] = 'u';
  local_88[0x3e] = 'y';
  local_88[0x3f] = '}';
  local_88[0x40] = 0x82;
  local_88[0x41] = 0x86;
  local_88[0x42] = 0x8a;
  local_88[0x43] = 0x8e;
  local_88[0x44] = 0x92;
  local_88[0x45] = 0x96;
  local_88[0x46] = 0x9a;
  local_88[0x47] = 0x9e;
  local_88[0x48] = 0xa2;
  local_88[0x49] = 0xa6;
  local_88[0x4a] = 0xaa;
  local_88[0x4b] = 0xae;
  local_88[0x4c] = 0xb2;
  local_88[0x4d] = 0xb6;
  local_88[0x4e] = 0xba;
  local_88[0x4f] = 0xbe;
  local_88[0x50] = 0xc3;
  local_88[0x51] = 199;
  local_88[0x52] = 0xcb;
  local_88[0x53] = 0xcf;
  local_88[0x54] = 0xd3;
  local_88[0x55] = 0xd7;
  local_88[0x56] = 0xdb;
  local_88[0x57] = 0xdf;
  local_88[0x58] = 0xe3;
  local_88[0x59] = 0xe7;
  local_88[0x5a] = 0xeb;
  local_88[0x5b] = 0xef;
  local_88[0x5c] = 0xf3;
  local_88[0x5d] = 0xf7;
  local_88[0x5e] = 0xfb;
  local_88[0x5f] = 0xff;
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match6_equals_1,local_88 + 0x20,0x40,mode)
  ;
  prepare_bc1_single_color_table_half
            ((bc1_match_entry *)g_bc1_match6_half,local_88 + 0x20,0x40,mode);
  pfVar9 = (float *)&DAT_0016d598;
  lVar10 = 0;
  do {
    bVar1 = (&g_unique_total_orders4)[lVar10 * 4];
    bVar2 = (&DAT_00124421)[lVar10 * 4];
    bVar3 = (&DAT_00124422)[lVar10 * 4];
    cVar4 = (&DAT_00124423)[lVar10 * 4];
    if ((((bVar1 != 0x10) && (bVar2 != 0x10)) && (bVar3 != 0x10)) && (cVar4 != '\x10')) {
      *(short *)(g_total_ordering4_hash +
                ((uint)bVar3 << 9 | (uint)bVar2 << 5 | (uint)bVar1 + (uint)bVar1)) = (short)lVar10;
    }
    auVar5[0xc] = cVar4;
    auVar5._0_12_ = ZEXT812(0);
    auVar6._10_3_ = auVar5._10_3_;
    auVar6._0_10_ = (unkuint10)bVar3 << 0x40;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar6._8_5_;
    uVar12 = CONCAT13(0,CONCAT12(bVar2,(ushort)bVar1));
    auVar7[4] = bVar2;
    auVar7._0_4_ = uVar12;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar8 << 0x40,6);
    uVar14 = (uint)(uint3)(auVar5._10_3_ >> 0x10) * 0x90000 + auVar7._4_4_ * 0x10204U +
             (int)(((ulong)auVar6._8_5_ & 0xffffffff) * 0x40201) + (uVar12 & 0xffff) * 9;
    fVar15 = (float)(uVar14 >> 0x10 & 0xff);
    uVar12 = uVar14 >> 8 & 0xff;
    fVar16 = fVar15 * (float)(uVar14 & 0xff) - (float)(uVar12 * uVar12);
    fVar16 = (float)(~-(uint)(ABS(fVar16) < 1e-08) & (uint)(0.011764706 / fVar16));
    *(ulong *)(pfVar9 + -2) = CONCAT44(-(float)uVar12 * fVar16,(float)(uVar14 & 0xff) * fVar16);
    *pfVar9 = fVar16 * fVar15;
    lVar10 = lVar10 + 1;
    pfVar9 = pfVar9 + 3;
  } while (lVar10 != 0x3c9);
  lVar10 = 0;
  do {
    lVar11 = lVar10 * 3;
    local_8b[0] = (&g_unique_total_orders3)[lVar11];
    local_8b[1] = (&DAT_00125351)[lVar11];
    local_8b[2] = (&DAT_00125352)[lVar11];
    if ((&DAT_00125352)[lVar11] != '\x10' && (local_8b[1] != 0x10 && local_8b[0] != 0x10)) {
      *(short *)(g_total_ordering3_hash + ((uint)local_8b[1] << 5 | (uint)local_8b[0] * 2)) =
           (short)lVar10;
    }
    lVar11 = 0;
    uVar12 = 0;
    pbVar13 = local_8b;
    do {
      uVar12 = uVar12 + (uint)*pbVar13 * *(int *)((long)&g_weight_vals3 + lVar11);
      lVar11 = lVar11 + 4;
      pbVar13 = pbVar13 + 1;
    } while (lVar11 != 0xc);
    fVar15 = (float)(uVar12 >> 0x10 & 0xff);
    uVar14 = uVar12 >> 8 & 0xff;
    fVar16 = fVar15 * (float)(uVar12 & 0xff) - (float)(uVar14 * uVar14);
    fVar16 = (float)(~-(uint)(ABS(fVar16) < 1e-08) & (uint)(0.007843138 / fVar16));
    *(ulong *)((long)&g_selector_factors3 + lVar10 * 0xc) =
         CONCAT44(-(float)uVar14 * fVar16,(float)(uVar12 & 0xff) * fVar16);
    (&DAT_00170508)[lVar10 * 3] = fVar16 * fVar15;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x99);
  return 0x99;
}

Assistant:

void init(bc1_approx_mode mode)
	{
		g_bc1_approx_mode = mode;
								
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, mode);
		prepare_bc1_single_color_table_half(g_bc1_match5_half, bc1_expand5, 32, mode);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, mode);
		prepare_bc1_single_color_table_half(g_bc1_match6_half, bc1_expand6, 64, mode);

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS4; i++)
		{
			hist4 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders4[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders4[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders4[i][2];
			h.m_hist[3] = (uint8_t)g_unique_total_orders4[i][3];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4) | (h.m_hist[2] << 8);
				assert(index < 4096);
				g_total_ordering4_hash[index] = (uint16_t)i;
			}

			compute_selector_factors4(h, g_selector_factors4[i][0], g_selector_factors4[i][1], g_selector_factors4[i][2]);
		}

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS3; i++)
		{
			hist3 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders3[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders3[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders3[i][2];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4);
				assert(index < 256);
				g_total_ordering3_hash[index] = (uint16_t)i;
			}

			compute_selector_factors3(h, g_selector_factors3[i][0], g_selector_factors3[i][1], g_selector_factors3[i][2]);
		}

		g_initialized = true;
	}